

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anandan.c
# Opt level: O0

void valid_option(int argc,char **argv,char *in_path,char *out_path,int *n1,int *n2,int *level,
                 int *h_type,int *histo,int *sm,int *sp,int *sf,int *pyr,int *ssd,int *f_type,
                 float *trsh,char *i_fname,char *v_fname,char *c_fname,char *h_fname,int *nbin,
                 float *incr,int *iter,int *binary,int *row,int *col)

{
  int iVar1;
  int local_130;
  int local_12c;
  int fn;
  int i;
  string str_trsh;
  string t0;
  string ext;
  int *n2_local;
  int *n1_local;
  char *out_path_local;
  char *in_path_local;
  char **argv_local;
  int argc_local;
  
  if (argc == 1) {
    usage();
  }
  if ((argc < 0x19) && (3 < argc)) {
    *binary = 0;
    *sm = 1;
    *sp = 1;
    *sf = 0;
    *pyr = 2;
    *level = 1;
    *histo = 0;
    local_130 = 0;
    *ssd = 3;
    *trsh = 0.0;
    *nbin = 0;
    *iter = 10;
    strcpy(i_fname,"Undefined");
    strcpy(v_fname,"Undefined");
    strcpy(c_fname,"Undefined");
    strcpy(h_fname,"Undefined");
  }
  else {
    error(1);
  }
  local_12c = 4;
  while (local_12c < argc) {
    iVar1 = strcmp("-NR",argv[local_12c]);
    if (iVar1 == 0) {
      *sm = 0;
      local_12c = local_12c + 1;
    }
    else {
      iVar1 = strcmp("-F",argv[local_12c]);
      if (iVar1 == 0) {
        if (local_12c + 1 < argc) {
          __isoc99_sscanf(argv[local_12c + 1],"%f",trsh);
          strcpy((char *)&fn,argv[local_12c + 1]);
          if (*sf == 1) {
            error(3);
          }
          *sf = 1;
          *f_type = 0;
          local_12c = local_12c + 2;
        }
        else {
          error(1);
        }
      }
      else {
        iVar1 = strcmp("-C",argv[local_12c]);
        if (iVar1 == 0) {
          if (local_12c + 3 < argc) {
            strcpy(c_fname,argv[local_12c + 1]);
            __isoc99_sscanf(argv[local_12c + 2],"%d",nbin);
            __isoc99_sscanf(argv[local_12c + 3],"%f",incr);
            *h_type = 0;
            *histo = 1;
            local_12c = local_12c + 4;
          }
          else {
            error(1);
          }
        }
        else {
          iVar1 = strcmp("-P",argv[local_12c]);
          if (iVar1 == 0) {
            *sp = 0;
            local_12c = local_12c + 1;
          }
          else {
            iVar1 = strcmp("-L",argv[local_12c]);
            if (iVar1 == 0) {
              if (local_12c + 1 < argc) {
                __isoc99_sscanf(argv[local_12c + 1],"%d",level);
                local_12c = local_12c + 2;
              }
              else {
                error(1);
              }
            }
            else {
              iVar1 = strcmp("-I",argv[local_12c]);
              if (iVar1 == 0) {
                if (local_12c + 1 < argc) {
                  __isoc99_sscanf(argv[local_12c + 1],"%d",iter);
                  local_12c = local_12c + 2;
                }
                else {
                  error(1);
                }
              }
              else {
                iVar1 = strcmp("-W",argv[local_12c]);
                if (iVar1 == 0) {
                  if (local_12c + 1 < argc) {
                    __isoc99_sscanf(argv[local_12c + 1],"%d",ssd);
                    local_12c = local_12c + 2;
                  }
                  else {
                    error(1);
                  }
                }
                else {
                  iVar1 = strcmp("-N",argv[local_12c]);
                  if (iVar1 == 0) {
                    if (local_12c + 2 < argc) {
                      __isoc99_sscanf(argv[local_12c + 1],"%d",n1);
                      __isoc99_sscanf(argv[local_12c + 2],"%d",n2);
                      local_130 = 1;
                      local_12c = local_12c + 3;
                    }
                    else {
                      error(1);
                    }
                  }
                  else {
                    iVar1 = strcmp("-B",argv[local_12c]);
                    if (iVar1 == 0) {
                      if (local_12c + 2 < argc) {
                        __isoc99_sscanf(argv[local_12c + 1],"%d",col);
                        __isoc99_sscanf(argv[local_12c + 2],"%d",row);
                        *binary = 1;
                        local_12c = local_12c + 3;
                      }
                      else {
                        error(1);
                      }
                    }
                    else {
                      error(2);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (100 < *nbin) {
    error(0xd);
  }
  if (4 < *level) {
    error(4);
  }
  if (((*ssd != 3) && (*ssd != 5)) && (*ssd != 7)) {
    error(0x10);
  }
  if (local_130 == 0) {
    error(0x11);
  }
  if (*n1 == *n2) {
    error(0x12);
  }
  concat(argv[1],"/",in_path);
  concat(argv[2],"/",out_path);
  concat(in_path,argv[3],i_fname);
  strcpy(t0 + 0x48,"-n");
  sprintf(str_trsh + 0x48,"%d",(ulong)(uint)*n1);
  concat(t0 + 0x48,str_trsh + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-",t0 + 0x48);
  sprintf(str_trsh + 0x48,"%d",(ulong)(uint)*n2);
  concat(t0 + 0x48,str_trsh + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-w",t0 + 0x48);
  sprintf(str_trsh + 0x48,"%d",(ulong)(uint)*ssd);
  concat(t0 + 0x48,str_trsh + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-l",t0 + 0x48);
  sprintf(str_trsh + 0x48,"%d",(ulong)(uint)*level);
  concat(t0 + 0x48,str_trsh + 0x48,t0 + 0x48);
  concat(t0 + 0x48,"-i",t0 + 0x48);
  sprintf(str_trsh + 0x48,"%d",(ulong)(uint)*iter);
  concat(t0 + 0x48,str_trsh + 0x48,t0 + 0x48);
  if (*sm == 0) {
    concat(t0 + 0x48,"-r",t0 + 0x48);
  }
  if (*sp == 0) {
    concat(t0 + 0x48,"-s",t0 + 0x48);
  }
  if (*sf != 0) {
    concat(t0 + 0x48,"-f",t0 + 0x48);
    concat(t0 + 0x48,(char *)&fn,t0 + 0x48);
  }
  concat(out_path,*argv,v_fname);
  concat(v_fname,".",v_fname);
  concat(v_fname,argv[3],v_fname);
  concat(v_fname,"F",v_fname);
  concat(v_fname,t0 + 0x48,v_fname);
  if (*histo != 0) {
    concat(out_path,*argv,h_fname);
    concat(h_fname,".",h_fname);
    concat(h_fname,argv[3],h_fname);
    concat(h_fname,"H",h_fname);
    concat(h_fname,t0 + 0x48,h_fname);
  }
  printf(" Generated velocity filename  : %s\n",v_fname);
  printf(" Generated histogram filename : %s\n",h_fname);
  printf(" Input stem name              : %s\n",i_fname);
  printf(" Correct velocity filename    : %s\n",c_fname);
  fflush(_stdout);
  return;
}

Assistant:

void valid_option(argc,argv,in_path,out_path,n1,n2,level,h_type,histo,sm,sp,sf,pyr,
ssd,f_type,trsh,i_fname,v_fname,c_fname,h_fname,nbin,incr,iter,binary,row,col)
char *argv[] ;
int argc, *n1, *n2, *iter, *level, *h_type, *histo, *sm, *sp, *sf, *pyr,
    *f_type, *nbin, *ssd, *binary, *row, *col ;
float *trsh, *incr ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ string ext, t0, str_trsh ;
  int i, fn ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 24) && (argc >= 4)) {
    *binary = FALSE ;
    *sm = TRUE ;
    *sp = TRUE ;
    *sf = FALSE ;
    *pyr = LAP ;
    *level = DEFLEVEL ;
    *histo = FALSE ;
    fn = FALSE ;
    *ssd = 3 ;
    *trsh = 0.0 ;
    *nbin = 0 ;
    *iter = RELAXITER ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-NR",argv[i]) == 0) {
      *sm = FALSE ;
      i += 1 ;
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          if (*sf == TRUE) {
            error(3) ;
          }
          *sf = TRUE ;
          *f_type = CMIN ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *h_type = CMIN ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-P",argv[i]) == 0) {
            *sp = FALSE ;
            i += 1 ;
          }
          else {
            if (strcmp("-L",argv[i]) == 0) {
              if ( i + 1 < argc) {
                sscanf(argv[i+1],"%d",level) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-I",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%d",iter) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-W",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",ssd) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-N",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",n1) ;
                      sscanf(argv[i+2],"%d",n2) ;
                      fn = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-B",argv[i]) == 0) {
                      if (i + 2 < argc) {
                        sscanf(argv[i+1],"%d",col) ;
                        sscanf(argv[i+2],"%d",row) ;
                        *binary = TRUE ;
                        i += 3 ;
                      }
                      else {
                        error(1) ;
                      }
                    }
                    else {
                      error(2) ;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(13) ;
  }
  if (*level > MAXLEVEL) {
    error(4) ;
  }
  if (*ssd != 3 && *ssd != 5 && *ssd != 7) {
    error(16) ;
  }
  if (!fn) {
    error(17) ;
  }
  if (*n1 == *n2) {
    error(18) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;

  concat(in_path,argv[3],i_fname) ;

  strcpy(ext,"-n") ;
  sprintf(t0,"%d",*n1);
  concat(ext,t0,ext) ;
  concat(ext,"-",ext) ;
  sprintf(t0,"%d",*n2);
  concat(ext,t0,ext) ;
  concat(ext,"-w",ext) ;
  sprintf(t0,"%d",*ssd);
  concat(ext,t0,ext) ;
  concat(ext,"-l",ext) ;
  sprintf(t0,"%d",*level);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  if (!(*sm)) {
    concat(ext,"-r",ext) ;
  }
  if (!(*sp)) {
    concat(ext,"-s",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}